

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void discordpp::from_json(json *j,EmbedImage *t)

{
  bool bVar1;
  const_reference pvVar2;
  EmbedImage *t_local;
  json *j_local;
  
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[4],_0>(j,(char (*) [4])0x33846f);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[4],_0>(j,(char (*) [4])0x33846f);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_to<discordpp::field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (pvVar2,&t->url);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[10],_0>(j,(char (*) [10])"proxy_url");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[10],_0>(j,(char (*) [10])"proxy_url");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_to<discordpp::omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (pvVar2,&t->proxy_url);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(j,(char (*) [7])"height");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[7],_0>(j,(char (*) [7])"height");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::omittable_field<int>,_0>(pvVar2,&t->height);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[6],_0>(j,(char (*) [6])"width");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[6],_0>(j,(char (*) [6])"width");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::omittable_field<int>,_0>(pvVar2,&t->width);
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, EmbedImage &t) {
        if(j.contains("url")){j.at("url").get_to(t.url);}
        if(j.contains("proxy_url")){j.at("proxy_url").get_to(t.proxy_url);}
        if(j.contains("height")){j.at("height").get_to(t.height);}
        if(j.contains("width")){j.at("width").get_to(t.width);}
    }